

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O1

void __thiscall cppcms::plugin::scope::load(scope *this,string *name)

{
  pointer pcVar1;
  pointer pbVar2;
  long lVar3;
  char cVar4;
  iterator iVar5;
  locale *loc;
  shared_object *this_00;
  _data *p_Var6;
  long *plVar7;
  ostream *poVar8;
  runtime_error *prVar9;
  mapped_type *pmVar10;
  size_type *psVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  long lVar14;
  shared_ptr<booster::shared_object> obj;
  string so_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  unique_lock<std::mutex> guard;
  string path;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string_type local_220;
  formattible_type local_200;
  undefined1 local_1f0 [24];
  unique_lock<std::mutex> local_1d8;
  string_type local_1c8;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  char local_178 [16];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158 [2];
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138 [2];
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118 [20];
  pointer local_78;
  
  class_data();
  local_1d8._M_device = &class_data::d.lock;
  local_1d8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_1d8);
  local_1d8._M_owns = true;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&class_data::d.modules._M_t,name);
  if ((_Rb_tree_header *)iVar5._M_node != &class_data::d.modules._M_t._M_impl.super__Rb_tree_header)
  goto LAB_00228d92;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  p_Var6 = (this->d).ptr_;
  if ((p_Var6->pattern)._M_string_length == 0) {
    booster::shared_object::name((string *)local_1a8);
    std::__cxx11::string::operator=((string *)&local_240,(string *)local_1a8);
    _Var13._M_p = (pointer)local_1a8._0_8_;
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_00228a4a;
  }
  else {
    pcVar1 = (p_Var6->pattern)._M_dataplus._M_p;
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar1,pcVar1 + (p_Var6->pattern)._M_string_length);
    booster::locale::basic_format<char>::basic_format((basic_format<char> *)local_1a8,&local_1c8);
    local_200.writer_ = booster::locale::details::formattible<char>::write<std::__cxx11::string>;
    local_200.pointer_ = name;
    booster::locale::basic_format<char>::add((basic_format<char> *)local_1a8,&local_200);
    loc = (locale *)std::locale::classic();
    booster::locale::basic_format<char>::str_abi_cxx11_
              (&local_220,(basic_format<char> *)local_1a8,loc);
    std::__cxx11::string::operator=((string *)&local_240,(string *)&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    if (local_78 != (pointer)0x0) {
      operator_delete(local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         **)local_128._M_p != local_118) {
      operator_delete(local_128._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         **)local_148._M_p != local_138) {
      operator_delete(local_148._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         **)local_168._M_p != local_158) {
      operator_delete(local_168._M_p);
    }
    if (local_188._M_p != local_1a8 + 0x30) {
      operator_delete(local_188._M_p);
    }
    _Var13._M_p = local_1c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
LAB_00228a4a:
      operator_delete(_Var13._M_p);
    }
  }
  this_00 = (shared_object *)operator_new(8);
  booster::shared_object::shared_object(this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<booster::shared_object*>
            (&local_248,this_00);
  p_Var6 = (this->d).ptr_;
  if ((p_Var6->paths).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (p_Var6->paths).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cVar4 = booster::shared_object::open((string *)this_00,(int)&local_240);
    if (cVar4 == '\0') {
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Failed to load ",&local_240);
      booster::runtime_error::runtime_error(prVar9,(string *)local_1a8);
      *(undefined ***)prVar9 = &PTR__runtime_error_00287810;
      (prVar9->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
      __cxa_throw(prVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  else {
    p_Var6 = (this->d).ptr_;
    local_1f0._16_8_ = name;
    if ((p_Var6->paths).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (p_Var6->paths).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar14 = 8;
      uVar12 = 0;
      do {
        pbVar2 = (p_Var6->paths).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = *(long *)((long)pbVar2 + lVar14 + -8);
        local_1a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1a8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,lVar3,
                   *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar14) + lVar3);
        if ((char_type *)local_1a8._8_8_ == (char_type *)0x0) {
          std::__cxx11::string::_M_assign((string *)local_1a8);
        }
        else {
          local_200.pointer_ = local_1f0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_200,local_1a8._0_8_,
                     (char_type *)(local_1a8._8_8_ + local_1a8._0_8_));
          std::__cxx11::string::append((char *)&local_200);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_200,(ulong)local_240._M_dataplus._M_p);
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_220.field_2._M_allocated_capacity = *psVar11;
            local_220.field_2._8_8_ = plVar7[3];
            local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          }
          else {
            local_220.field_2._M_allocated_capacity = *psVar11;
            local_220._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_220._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_1a8,(string *)&local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p);
          }
          if ((string *)local_200.pointer_ != (string *)local_1f0) {
            operator_delete(local_200.pointer_);
          }
        }
        cVar4 = booster::shared_object::open((string *)this_00,(int)(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_);
        }
        if (cVar4 != '\0') break;
        p_Var6 = (this->d).ptr_;
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x20;
      } while (uVar12 < (ulong)((long)(p_Var6->paths).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(p_Var6->paths).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    cVar4 = booster::shared_object::is_open();
    name = (string *)local_1f0._16_8_;
    if (cVar4 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Failed to load ",0xf)
      ;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_240._M_dataplus._M_p,local_240._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," from ",6);
      p_Var6 = (this->d).ptr_;
      if ((p_Var6->paths).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (p_Var6->paths).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar14 = 8;
        uVar12 = 0;
        do {
          if (uVar12 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"`",1);
          pbVar2 = (((this->d).ptr_)->paths).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)((long)pbVar2 + lVar14 + -8),
                              *(long *)((long)&pbVar2->_M_dataplus + lVar14));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\'",1);
          p_Var6 = (this->d).ptr_;
          uVar12 = uVar12 + 1;
          lVar14 = lVar14 + 0x20;
        } while (uVar12 < (ulong)((long)(p_Var6->paths).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(p_Var6->paths).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      booster::runtime_error::runtime_error(prVar9,&local_220);
      *(undefined ***)prVar9 = &PTR__runtime_error_00287810;
      (prVar9->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00287838;
      __cxa_throw(prVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::shared_object>_>_>_>
            ::operator[](&((this->d).ptr_)->objects,name);
  (pmVar10->super___shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = this_00
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar10->super___shared_ptr<booster::shared_object,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,&local_248);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&class_data::d.modules,name);
  if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
LAB_00228d92:
  std::unique_lock<std::mutex>::~unique_lock(&local_1d8);
  return;
}

Assistant:

void scope::load(std::string const &name)
{
	_class_data &cls = class_data();
	booster::unique_lock<booster::mutex> guard(cls.lock);
	if(cls.modules.find(name)!=cls.modules.end())
		return;
	std::string so_name;
	if(d->pattern.empty())
		so_name = booster::shared_object::name(name);
	else
		so_name = (booster::locale::format(d->pattern) % name).str(std::locale::classic());

	booster::shared_ptr<booster::shared_object> obj(new booster::shared_object());
	int dlflags = booster::shared_object::load_lazy |  booster::shared_object::load_global;
	if(d->paths.empty()) {
		if(!obj->open(so_name,dlflags)) 
			throw cppcms_error("Failed to load " + so_name);
	}
	else {
		for(size_t i=0;i<d->paths.size();i++) {
			std::string path  = d->paths[i];
			if(path.empty())
				path = so_name;
			else
				path = path + "/" + so_name;
			if(obj->open(path,dlflags))
				break;
		}
		if(!obj->is_open()) {
			std::ostringstream ss;
			ss << "Failed to load " << so_name << " from ";
			for(size_t i=0;i<d->paths.size();i++) {
				if(i!=0) {
					ss << ", ";
				}
				ss << "`" << d->paths[i] << "'";
			}
			throw cppcms_error(ss.str());
		}
	}
	d->objects[name]=obj;
	cls.modules.insert(name);
}